

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  _Manager_type p_Var1;
  FILE *__stream;
  _Any_data _Var2;
  bool bVar3;
  int iVar4;
  mapped_type *pmVar5;
  int *piVar6;
  long lVar7;
  void *pvVar8;
  long *plVar9;
  undefined8 *puVar10;
  undefined8 uVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  SDL_Window *__nptr;
  bool isInitialized;
  thread worker;
  SDL_Window *window;
  int playbackId;
  int captureId;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  argm;
  _Any_data __tmp;
  _Any_data __tmp_1;
  _Any_data local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  undefined1 local_b9;
  key_type local_b8;
  SDL_Window *local_98;
  undefined4 local_90;
  undefined4 local_8c;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_88 [88];
  
  local_e8._8_8_ = local_e8._M_unused._M_object;
  parseCmdArguments_abi_cxx11_((int)local_88,(char **)(ulong)(uint)argc);
  local_e8._M_unused._M_object = &local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"c","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](local_88,(key_type *)&local_e8);
  if (pmVar5->_M_string_length == 0) {
    lVar7 = 0;
LAB_0010f1b8:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_unused._0_8_ != &local_d8) {
      operator_delete(local_e8._M_unused._M_object);
    }
    local_8c = (undefined4)lVar7;
    local_e8._M_unused._M_object = &local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"p","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_88,(key_type *)&local_e8);
    if (pmVar5->_M_string_length == 0) {
      lVar7 = 0;
LAB_0010f2a5:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_unused._0_8_ != &local_d8) {
        operator_delete(local_e8._M_unused._M_object);
      }
      local_90 = (undefined4)lVar7;
      iVar4 = SDL_Init(0x20);
      __stream = _stderr;
      if (iVar4 == 0) {
        ImGui_PreInit();
        local_98 = (SDL_Window *)SDL_CreateWindow("Waver",0x2fff0000,0x2fff0000,400,600,0x2022);
        pvVar8 = (void *)SDL_GL_CreateContext(local_98);
        SDL_GL_MakeCurrent(local_98,pvVar8);
        SDL_GL_SetSwapInterval(1);
        ImGui_Init(local_98,pvVar8);
        lVar7 = ImGui::GetIO();
        *(undefined8 *)(lVar7 + 0x18) = 0;
        getBinaryPath_abi_cxx11_();
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 == paVar12) {
          local_d8._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_d8._8_8_ = plVar9[3];
          local_e8._M_unused._M_object = &local_d8;
        }
        else {
          local_d8._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_e8._M_unused._M_object =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar9;
        }
        local_e8._8_8_ = plVar9[1];
        *plVar9 = (long)paVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        bVar3 = ImGui_tryLoadFont((string *)&local_e8,17.5,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_unused._0_8_ != &local_d8) {
          operator_delete(local_e8._M_unused._M_object);
        }
        paVar12 = &local_b8.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != paVar12) {
          operator_delete(local_b8._M_dataplus._M_p);
        }
        if (!bVar3) {
          getBinaryPath_abi_cxx11_();
          puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_b8);
          paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar10 == paVar13) {
            local_d8._M_allocated_capacity = paVar13->_M_allocated_capacity;
            local_d8._8_8_ = puVar10[3];
            local_e8._M_unused._M_object = &local_d8;
          }
          else {
            local_d8._M_allocated_capacity = paVar13->_M_allocated_capacity;
            local_e8._M_unused._M_object =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar10;
          }
          local_e8._8_8_ = puVar10[1];
          *puVar10 = paVar13;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          bVar3 = ImGui_tryLoadFont((string *)&local_e8,17.5,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_unused._0_8_ != &local_d8) {
            operator_delete(local_e8._M_unused._M_object);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != paVar12) {
            operator_delete(local_b8._M_dataplus._M_p);
          }
          if (!bVar3) {
            getBinaryPath_abi_cxx11_();
            puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_b8);
            paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar10 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 == paVar13) {
              local_d8._M_allocated_capacity = paVar13->_M_allocated_capacity;
              local_d8._8_8_ = puVar10[3];
              local_e8._M_unused._M_object = &local_d8;
            }
            else {
              local_d8._M_allocated_capacity = paVar13->_M_allocated_capacity;
              local_e8._M_unused._M_object =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar10;
            }
            local_e8._8_8_ = puVar10[1];
            *puVar10 = paVar13;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            bVar3 = ImGui_tryLoadFont((string *)&local_e8,17.5,false);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_unused._0_8_ != &local_d8) {
              operator_delete(local_e8._M_unused._M_object);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != paVar12) {
              operator_delete(local_b8._M_dataplus._M_p);
            }
            if (!bVar3) {
              getBinaryPath_abi_cxx11_();
              puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_b8);
              paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(puVar10 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar10 == paVar13) {
                local_d8._M_allocated_capacity = paVar13->_M_allocated_capacity;
                local_d8._8_8_ = puVar10[3];
                local_e8._M_unused._M_object = &local_d8;
              }
              else {
                local_d8._M_allocated_capacity = paVar13->_M_allocated_capacity;
                local_e8._M_unused._M_object =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*puVar10;
              }
              local_e8._8_8_ = puVar10[1];
              *puVar10 = paVar13;
              puVar10[1] = 0;
              *(undefined1 *)(puVar10 + 2) = 0;
              ImGui_tryLoadFont((string *)&local_e8,17.5,false);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8._M_unused._0_8_ != &local_d8) {
                operator_delete(local_e8._M_unused._M_object);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p != paVar12) {
                operator_delete(local_b8._M_dataplus._M_p);
              }
            }
          }
        }
        getBinaryPath_abi_cxx11_();
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_b8);
        paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 == paVar13) {
          local_d8._M_allocated_capacity = paVar13->_M_allocated_capacity;
          local_d8._8_8_ = puVar10[3];
          local_e8._M_unused._M_object = &local_d8;
        }
        else {
          local_d8._M_allocated_capacity = paVar13->_M_allocated_capacity;
          local_e8._M_unused._M_object =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar10;
        }
        local_e8._8_8_ = puVar10[1];
        *puVar10 = paVar13;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        bVar3 = ImGui_tryLoadFont((string *)&local_e8,17.5,true);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_unused._0_8_ != &local_d8) {
          operator_delete(local_e8._M_unused._M_object);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != paVar12) {
          operator_delete(local_b8._M_dataplus._M_p);
        }
        if (!bVar3) {
          getBinaryPath_abi_cxx11_();
          puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_b8);
          paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar10 == paVar13) {
            local_d8._M_allocated_capacity = paVar13->_M_allocated_capacity;
            local_d8._8_8_ = puVar10[3];
            local_e8._M_unused._M_object = &local_d8;
          }
          else {
            local_d8._M_allocated_capacity = paVar13->_M_allocated_capacity;
            local_e8._M_unused._M_object =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar10;
          }
          local_e8._8_8_ = puVar10[1];
          *puVar10 = paVar13;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          bVar3 = ImGui_tryLoadFont((string *)&local_e8,17.5,true);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_unused._0_8_ != &local_d8) {
            operator_delete(local_e8._M_unused._M_object);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != paVar12) {
            operator_delete(local_b8._M_dataplus._M_p);
          }
          if (!bVar3) {
            getBinaryPath_abi_cxx11_();
            puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_b8);
            paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar10 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 == paVar13) {
              local_d8._M_allocated_capacity = paVar13->_M_allocated_capacity;
              local_d8._8_8_ = puVar10[3];
              local_e8._M_unused._M_object = &local_d8;
            }
            else {
              local_d8._M_allocated_capacity = paVar13->_M_allocated_capacity;
              local_e8._M_unused._M_object =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar10;
            }
            local_e8._8_8_ = puVar10[1];
            *puVar10 = paVar13;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            bVar3 = ImGui_tryLoadFont((string *)&local_e8,17.5,true);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_unused._0_8_ != &local_d8) {
              operator_delete(local_e8._M_unused._M_object);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != paVar12) {
              operator_delete(local_b8._M_dataplus._M_p);
            }
            if (!bVar3) {
              getBinaryPath_abi_cxx11_();
              puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_b8);
              paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(puVar10 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar10 == paVar13) {
                local_d8._M_allocated_capacity = paVar13->_M_allocated_capacity;
                local_d8._8_8_ = puVar10[3];
                local_e8._M_unused._M_object = &local_d8;
              }
              else {
                local_d8._M_allocated_capacity = paVar13->_M_allocated_capacity;
                local_e8._M_unused._M_object =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*puVar10;
              }
              local_e8._8_8_ = puVar10[1];
              *puVar10 = paVar13;
              puVar10[1] = 0;
              *(undefined1 *)(puVar10 + 2) = 0;
              ImGui_tryLoadFont((string *)&local_e8,17.5,true);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8._M_unused._0_8_ != &local_d8) {
                operator_delete(local_e8._M_unused._M_object);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p != paVar12) {
                operator_delete(local_b8._M_dataplus._M_p);
              }
            }
          }
        }
        ImGui_SetStyle();
        SDL_EventState(0x1000,1);
        ImGui_NewFrame(local_98);
        ImGui::Render();
        local_b9 = 0;
        local_b8._M_dataplus._M_p = (pointer)0x0;
        local_e8._8_8_ = 0;
        plVar9 = (long *)operator_new(0x20);
        *plVar9 = (long)&local_90;
        plVar9[1] = (long)&local_8c;
        plVar9[2] = (long)&local_b8;
        plVar9[3] = (long)&local_b9;
        p_Var1 = g_doInit.super__Function_base._M_manager;
        local_e8._M_unused._M_object = plVar9;
        _Var2 = local_e8;
        local_e8 = g_doInit.super__Function_base._M_functor;
        g_doInit.super__Function_base._M_functor = _Var2;
        local_d8._M_allocated_capacity = (size_type)g_doInit.super__Function_base._M_manager;
        g_doInit.super__Function_base._M_manager =
             std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/examples/waver/main.cpp:263:16)>
             ::_M_manager;
        local_d8._8_8_ = g_doInit._M_invoker;
        g_doInit._M_invoker =
             std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/examples/waver/main.cpp:263:16)>
             ::_M_invoke;
        if (p_Var1 != (_Manager_type)0x0) {
          (*p_Var1)(&local_e8,&local_e8,__destroy_functor);
        }
        p_Var1 = g_setWindowSize.super__Function_base._M_manager;
        local_e8._8_8_ = 0;
        local_e8._M_unused._M_object = &local_98;
        _Var2 = local_e8;
        local_e8 = g_setWindowSize.super__Function_base._M_functor;
        g_setWindowSize.super__Function_base._M_functor = _Var2;
        local_d8._M_allocated_capacity = (size_type)g_setWindowSize.super__Function_base._M_manager;
        g_setWindowSize.super__Function_base._M_manager =
             std::
             _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/examples/waver/main.cpp:280:23)>
             ::_M_manager;
        local_d8._8_8_ = g_setWindowSize._M_invoker;
        g_setWindowSize._M_invoker =
             std::
             _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/examples/waver/main.cpp:280:23)>
             ::_M_invoke;
        if (p_Var1 != (_Manager_type)0x0) {
          (*p_Var1)(&local_e8,&local_e8,__destroy_functor);
        }
        p_Var1 = g_mainUpdate.super__Function_base._M_manager;
        local_e8._8_8_ = g_mainUpdate.super__Function_base._M_functor._8_8_;
        local_e8._M_unused._M_object =
             (void *)g_mainUpdate.super__Function_base._M_functor._M_unused._0_8_;
        local_d8._M_allocated_capacity = (size_type)g_mainUpdate.super__Function_base._M_manager;
        g_mainUpdate.super__Function_base._M_manager =
             std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/examples/waver/main.cpp:284:20)>
             ::_M_manager;
        local_d8._8_8_ = g_mainUpdate._M_invoker;
        g_mainUpdate._M_invoker =
             std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/examples/waver/main.cpp:284:20)>
             ::_M_invoke;
        g_mainUpdate.super__Function_base._M_functor._M_unused._M_object = &local_b9;
        g_mainUpdate.super__Function_base._M_functor._8_8_ = &local_98;
        if (p_Var1 != (_Manager_type)0x0) {
          (*p_Var1)(&local_e8,&local_e8,__destroy_functor);
        }
        if (g_doInit.super__Function_base._M_manager == (_Manager_type)0x0) {
LAB_0010fa4d:
          std::__throw_bad_function_call();
        }
        bVar3 = (*g_doInit._M_invoker)((_Any_data *)&g_doInit);
        if (bVar3) {
          do {
            if (g_mainUpdate.super__Function_base._M_manager == (_Manager_type)0x0)
            goto LAB_0010fa4d;
            bVar3 = (*g_mainUpdate._M_invoker)((_Any_data *)&g_mainUpdate);
          } while (bVar3);
          deinitMain();
          std::thread::join();
          GGWave_deinit();
          ImGui_Shutdown();
          ImGui::DestroyContext((ImGuiContext *)0x0);
          SDL_GL_DeleteContext(pvVar8);
          SDL_DestroyWindow(local_98);
          SDL_CloseAudio();
          iVar4 = 0;
          SDL_Quit();
        }
        else {
          puts("Error: failed to initialize audio");
          iVar4 = -2;
        }
        if ((SDL_Window *)local_b8._M_dataplus._M_p != (SDL_Window *)0x0) {
          std::terminate();
        }
      }
      else {
        uVar11 = SDL_GetError();
        fprintf(__stream,"Error: %s\n",uVar11);
        iVar4 = -1;
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_88);
      return iVar4;
    }
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"p","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_88,&local_b8);
    __nptr = (SDL_Window *)(pmVar5->_M_dataplus)._M_p;
    piVar6 = __errno_location();
    iVar4 = *piVar6;
    *piVar6 = 0;
    lVar7 = strtol((char *)__nptr,(char **)&local_98,10);
    if (local_98 != __nptr) {
      if ((0xfffffffeffffffff < lVar7 - 0x80000000U) && (*piVar6 != 0x22)) {
        if (*piVar6 == 0) {
          *piVar6 = iVar4;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p);
        }
        goto LAB_0010f2a5;
      }
      goto LAB_0010fa76;
    }
  }
  else {
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"c","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_88,&local_b8);
    __nptr = (SDL_Window *)(pmVar5->_M_dataplus)._M_p;
    piVar6 = __errno_location();
    iVar4 = *piVar6;
    *piVar6 = 0;
    lVar7 = strtol((char *)__nptr,(char **)&local_98,10);
    if (local_98 == __nptr) {
      std::__throw_invalid_argument("stoi");
    }
    else if ((0xfffffffeffffffff < lVar7 - 0x80000000U) && (*piVar6 != 0x22)) {
      if (*piVar6 == 0) {
        *piVar6 = iVar4;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
      goto LAB_0010f1b8;
    }
    std::__throw_out_of_range("stoi");
  }
  std::__throw_invalid_argument("stoi");
LAB_0010fa76:
  uVar11 = std::__throw_out_of_range("stoi");
  if ((SDL_Window **)local_e8._M_unused._0_8_ != &local_98) {
    operator_delete(local_e8._M_unused._M_object);
  }
  if ((SDL_Window *)local_b8._M_dataplus._M_p != __nptr) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_88);
  _Unwind_Resume(uVar11);
}

Assistant:

int main(int argc, char** argv) {
#ifdef __EMSCRIPTEN__
    printf("Build time: %s\n", BUILD_TIMESTAMP);
    printf("Press the Init button to start\n");

    if (argv[1]) {
        GGWave_setDefaultCaptureDeviceName(argv[1]);
    }
#endif

    auto argm = parseCmdArguments(argc, argv);
    int captureId = argm["c"].empty() ? 0 : std::stoi(argm["c"]);
    int playbackId = argm["p"].empty() ? 0 : std::stoi(argm["p"]);

    if (SDL_Init(SDL_INIT_VIDEO) != 0) {
        fprintf(stderr, "Error: %s\n", SDL_GetError());
        return -1;
    }

    ImGui_PreInit();

    int windowX = 400;
    int windowY = 600;

    // Waver video settings
    //float scale = 0.65;

    //int windowX = scale*570;
    //int windowY = scale*917;

    const char * windowTitle = "Waver";

#ifdef __EMSCRIPTEN__
    SDL_Renderer * renderer;
    SDL_Window * window;
    SDL_CreateWindowAndRenderer(windowX, windowY, SDL_WINDOW_OPENGL, &window, &renderer);
#else
    SDL_WindowFlags window_flags = (SDL_WindowFlags)(SDL_WINDOW_OPENGL | SDL_WINDOW_RESIZABLE | SDL_WINDOW_ALLOW_HIGHDPI);
    SDL_Window * window = SDL_CreateWindow(windowTitle, SDL_WINDOWPOS_CENTERED, SDL_WINDOWPOS_CENTERED, windowX, windowY, window_flags);
#endif

    void * gl_context = SDL_GL_CreateContext(window);

    SDL_GL_MakeCurrent(window, gl_context);
    SDL_GL_SetSwapInterval(1); // Enable vsync

    ImGui_Init(window, gl_context);
    ImGui::GetIO().IniFilename = nullptr;

    {
        bool isNotLoaded = true;
        isNotLoaded = isNotLoaded && !ImGui_tryLoadFont(getBinaryPath() + "DroidSans.ttf", kGlobalImGuiScale*14.0f, false);
        isNotLoaded = isNotLoaded && !ImGui_tryLoadFont(getBinaryPath() + "../bin/DroidSans.ttf", kGlobalImGuiScale*14.0f, false);
        isNotLoaded = isNotLoaded && !ImGui_tryLoadFont(getBinaryPath() + "../examples/assets/fonts/DroidSans.ttf", kGlobalImGuiScale*14.0f, false);
        isNotLoaded = isNotLoaded && !ImGui_tryLoadFont(getBinaryPath() + "../../examples/assets/fonts/DroidSans.ttf", kGlobalImGuiScale*14.0f, false);
    }

    {
        bool isNotLoaded = true;
        isNotLoaded = isNotLoaded && !ImGui_tryLoadFont(getBinaryPath() + "fontawesome-webfont.ttf", kGlobalImGuiScale*14.0f, true);
        isNotLoaded = isNotLoaded && !ImGui_tryLoadFont(getBinaryPath() + "../bin/fontawesome-webfont.ttf", kGlobalImGuiScale*14.0f, true);
        isNotLoaded = isNotLoaded && !ImGui_tryLoadFont(getBinaryPath() + "../examples/assets/fonts/fontawesome-webfont.ttf", kGlobalImGuiScale*14.0f, true);
        isNotLoaded = isNotLoaded && !ImGui_tryLoadFont(getBinaryPath() + "../../examples/assets/fonts/fontawesome-webfont.ttf", kGlobalImGuiScale*14.0f, true);
    }

    ImGui_SetStyle();

    SDL_EventState(SDL_DROPFILE, SDL_ENABLE);

    ImGui_NewFrame(window);
    ImGui::Render();

    // tmp
    //addFile("test0.raw", "test0.raw", std::vector<char>(1024));
    //addFile("test1.jpg", "test0.jpg", std::vector<char>(1024*1024 + 624));
    //addFile("test2.mpv", "test0.mov", std::vector<char>(1024*1024*234 + 53827));

    bool isInitialized = false;
    std::thread worker;

    g_doInit = [&]() {
        if (GGWave_init(playbackId, captureId) == false) {
            fprintf(stderr, "Failed to initialize GGWave\n");
            return false;
        }

#ifdef __EMSCRIPTEN__
        initMain();
#else
        worker = initMainAndRunCore();
#endif

        isInitialized = true;

        return true;
    };

    g_setWindowSize = [&](int sizeX, int sizeY) {
        SDL_SetWindowSize(window, sizeX, sizeY);
    };

    g_mainUpdate = [&]() {
        if (isInitialized == false) {
            return true;
        }

        if (ImGui_BeginFrame(window) == false) {
            return false;
        }

        renderMain();
        updateMain();

        ImGui_EndFrame(window);

#ifdef __EMSCRIPTEN__
        updateCore();
#endif

        return true;
    };

#ifdef __EMSCRIPTEN__
    emscripten_set_main_loop_arg(mainUpdate, NULL, 60, true);
#else
    if (g_doInit() == false) {
        printf("Error: failed to initialize audio\n");
        return -2;
    }

    while (true) {
        if (g_mainUpdate() == false) break;
    }

    deinitMain();
    worker.join();

    GGWave_deinit();

    // Cleanup
    ImGui_Shutdown();
    ImGui::DestroyContext();

    SDL_GL_DeleteContext(gl_context);
    SDL_DestroyWindow(window);
    SDL_CloseAudio();
    SDL_Quit();
#endif

    return 0;
}